

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::Decode
          (UnderwaterAcousticEmitterSystem *this,KDataStream *stream)

{
  KUINT8 *V;
  pointer pUVar1;
  pointer pUVar2;
  KUINT16 KVar3;
  KException *this_00;
  byte bVar4;
  pointer pUVar5;
  UnderwaterAcousticEmitterBeam UAEB;
  UnderwaterAcousticEmitterBeam local_60;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (KVar3 < 0x14) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_60.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&local_60.m_UAFPD;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Decode","");
    KException::KException(this_00,(KString *)&local_60,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  KDataStream::Read(stream,&this->m_ui8EmitterSystemDataLength);
  V = &this->m_ui8NumBeams;
  KDataStream::Read(stream,V);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
  (*(this->m_AES).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AES,stream);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Location,stream);
  pUVar1 = (this->m_vUAEB).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (this->m_vUAEB).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pUVar5 = pUVar1;
  if (pUVar2 != pUVar1) {
    do {
      (**(pUVar5->super_DataTypeBase)._vptr_DataTypeBase)(pUVar5);
      pUVar5 = pUVar5 + 1;
    } while (pUVar5 != pUVar2);
    (this->m_vUAEB).
    super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar1;
  }
  if (*V != '\0') {
    bVar4 = 0;
    do {
      UnderwaterAcousticEmitterBeam::UnderwaterAcousticEmitterBeam(&local_60);
      (*local_60.super_DataTypeBase._vptr_DataTypeBase[3])(&local_60,stream);
      std::
      vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
      ::push_back(&this->m_vUAEB,&local_60);
      UnderwaterAcousticEmitterBeam::~UnderwaterAcousticEmitterBeam(&local_60);
      bVar4 = bVar4 + 1;
    } while (bVar4 < *V);
  }
  return;
}

Assistant:

void UnderwaterAcousticEmitterSystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < UNDERWATER_ACOUSTIC_EMITTER_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8EmitterSystemDataLength
           >> m_ui8NumBeams
           >> m_ui16Padding1
           >> KDIS_STREAM m_AES
           >> KDIS_STREAM m_Location;

    m_vUAEB.clear();

    for( KUINT8 i = 0; i < m_ui8NumBeams; ++i )
    {
        UnderwaterAcousticEmitterBeam UAEB;
        stream >> KDIS_STREAM UAEB;
        m_vUAEB.push_back( UAEB );
    }
}